

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

uchar ** traverse<vector_bagwell<unsigned_char*,16u>,void(*)(unsigned_char**,int,int),unsigned_char>
                   (TrieNode<unsigned_char> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  TrieNode<unsigned_char> *node_00;
  void *pvVar1;
  void *pvVar2;
  size_t __n;
  uchar **__dest;
  long lVar3;
  uint i;
  ulong uVar4;
  vector_bagwell<unsigned_char_*,_16U> *bucket;
  ulong uVar5;
  long local_50;
  
  uVar4 = 0;
  do {
    node_00 = (TrieNode<unsigned_char> *)(node->buckets)._M_elems[uVar4];
    if (((node->is_trie).super__Base_bitset<4UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      if (node_00 != (TrieNode<unsigned_char> *)0x0) {
        pvVar2 = (node_00->buckets)._M_elems[3];
        if (pvVar2 == (void *)0x0) {
          local_50 = 0;
        }
        else {
          pvVar1 = (node_00->buckets)._M_elems[1];
          local_50 = (long)pvVar2 +
                     ((long)((1 << ((char)((uint)((int)pvVar1 - *(int *)(node_00->buckets)._M_elems)
                                          >> 3) + 3U & 0x1f)) + -0x10) * 8 -
                     *(long *)((long)pvVar1 + -8)) >> 3;
        }
        pvVar2 = (node_00->buckets)._M_elems[0];
        small_sort = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[1];
        __dest = dst;
        if (8 < (ulong)((long)small_sort - (long)pvVar2)) {
          lVar3 = 0x10;
          uVar5 = 1;
          do {
            if (lVar3 != 0) {
              memmove(__dest,*(void **)((long)pvVar2 + uVar5 * 8 + -8),lVar3 * 8);
            }
            __dest = __dest + lVar3;
            lVar3 = lVar3 * 2;
            uVar5 = uVar5 + 1;
            pvVar2 = (node_00->buckets)._M_elems[0];
            small_sort = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[1];
          } while (uVar5 < (ulong)((long)small_sort - (long)pvVar2 >> 3));
        }
        __n = (long)(node_00->buckets)._M_elems[3] - (long)*(void **)(small_sort + -8);
        if (__n != 0) {
          memmove(__dest,*(void **)(small_sort + -8),__n);
        }
        if (uVar4 != 0) {
          mkqsort(dst,(int)local_50,(int)depth);
        }
        dst = dst + local_50;
        vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell
                  ((vector_bagwell<unsigned_char_*,_16U> *)node_00);
        operator_delete(node_00);
      }
    }
    else {
      dst = traverse<vector_bagwell<unsigned_char*,16u>,void(*)(unsigned_char**,int,int),unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x100);
  if (node != (TrieNode<unsigned_char> *)0x0) {
    operator_delete(node);
  }
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}